

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maropuparser.h
# Opt level: O0

bool __thiscall
FastPForLib::MaropuGapReader::loadIntegers<std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (MaropuGapReader *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *buffer)

{
  ostream *poVar1;
  size_t sVar2;
  reference __ptr;
  size_type sVar3;
  int *piVar4;
  char *pcVar5;
  runtime_error *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  long in_RDI;
  size_t result;
  uint32_t number;
  size_type in_stack_ffffffffffffffa8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffb0;
  undefined1 local_1c [4];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_18;
  bool local_1;
  
  if (*(long *)(in_RDI + 0x20) == 0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"You forgot to open the file.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    local_1 = false;
  }
  else {
    local_18 = in_RSI;
    sVar2 = fread(local_1c,4,1,*(FILE **)(in_RDI + 0x20));
    if (sVar2 == 1) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      __ptr = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](local_18,0);
      sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_18);
      sVar2 = fread(__ptr,4,sVar3,*(FILE **)(in_RDI + 0x20));
      sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_18);
      if (sVar2 != sVar3) {
        poVar1 = std::operator<<((ostream *)&std::cerr,"IO status: ");
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        poVar1 = std::operator<<(poVar1,pcVar5);
        std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        poVar1 = std::operator<<((ostream *)&std::cerr,"Error reading from file ");
        std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"bad read");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool loadIntegers(container &buffer) {
    if (fd == NULL) {
      std::cerr << "You forgot to open the file." << std::endl;
      return false;
    }
    uint32_t number;
    size_t result = fread(&number, sizeof(number), 1, fd);
    if (result != 1) {
      return false;
    }
    buffer.resize(number);
    result = fread(&(buffer[0]), sizeof(uint32_t), buffer.size(), fd);
    if (result != buffer.size()) {
      std::cerr << "IO status: " << strerror(errno) << std::endl;
      std::cerr << "Error reading from file " << std::endl;
      throw std::runtime_error("bad read");
    }
    return true;
  }